

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O0

void duckdb_brotli::BrotliStoreHuffmanTree
               (uint8_t *depths,size_t num,HuffmanTree *tree,size_t *storage_ix,uint8_t *storage)

{
  size_t *in_RCX;
  uint8_t *in_R8;
  size_t code;
  int num_codes;
  size_t i;
  uint32_t huffman_tree_histogram [18];
  uint16_t code_length_bitdepth_symbols [18];
  uint8_t code_length_bitdepth [18];
  size_t huffman_tree_size;
  uint8_t huffman_tree_extra_bits [704];
  uint8_t huffman_tree [704];
  ulong local_660;
  int local_654;
  ulong local_650;
  int local_648 [6];
  uint8_t *in_stack_fffffffffffff9d0;
  uint8_t *in_stack_fffffffffffff9d8;
  size_t *in_stack_fffffffffffff9e0;
  uint8_t *in_stack_fffffffffffff9e8;
  HuffmanTree *in_stack_fffffffffffff9f0;
  int in_stack_fffffffffffff9fc;
  size_t in_stack_fffffffffffffa00;
  uint32_t *in_stack_fffffffffffffa08;
  uint8_t local_5c8 [24];
  ulong local_5b0;
  uint8_t local_5a8 [704];
  byte local_2e8 [704];
  uint8_t *local_28;
  size_t *local_20;
  
  local_5b0 = 0;
  local_28 = in_R8;
  local_20 = in_RCX;
  memset(local_5c8,0,0x12);
  memset(local_648,0,0x48);
  local_654 = 0;
  local_660 = 0;
  BrotliWriteHuffmanTree
            ((uint8_t *)in_stack_fffffffffffff9f0,(size_t)in_stack_fffffffffffff9e8,
             in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  for (local_650 = 0; local_650 < local_5b0; local_650 = local_650 + 1) {
    local_648[local_2e8[local_650]] = local_648[local_2e8[local_650]] + 1;
  }
  local_650 = 0;
  do {
    if (0x11 < local_650) {
LAB_0080b08d:
      BrotliCreateHuffmanTree
                (in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                 in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
      BrotliConvertBitDepthsToSymbols
                ((uint8_t *)in_stack_fffffffffffff9f0,(size_t)in_stack_fffffffffffff9e8,
                 (uint16_t *)in_stack_fffffffffffff9e0);
      BrotliStoreHuffmanTreeOfHuffmanTreeToBitMask(local_654,local_5c8,local_20,local_28);
      if (local_654 == 1) {
        local_5c8[local_660] = '\0';
      }
      BrotliStoreHuffmanTreeToBitMask
                (local_5b0,local_2e8,local_5a8,local_5c8,(uint16_t *)&stack0xfffffffffffffa08,
                 local_20,local_28);
      return;
    }
    if (local_648[local_650] != 0) {
      if (local_654 == 0) {
        local_660 = local_650;
        local_654 = 1;
      }
      else if (local_654 == 1) {
        local_654 = 2;
        goto LAB_0080b08d;
      }
    }
    local_650 = local_650 + 1;
  } while( true );
}

Assistant:

void duckdb_brotli::BrotliStoreHuffmanTree(const uint8_t* depths, size_t num,
                            HuffmanTree* tree,
                            size_t* storage_ix, uint8_t* storage) {
  /* Write the Huffman tree into the brotli-representation.
     The command alphabet is the largest, so this allocation will fit all
     alphabets. */
  /* TODO(eustas): fix me */
  uint8_t huffman_tree[BROTLI_NUM_COMMAND_SYMBOLS];
  uint8_t huffman_tree_extra_bits[BROTLI_NUM_COMMAND_SYMBOLS];
  size_t huffman_tree_size = 0;
  uint8_t code_length_bitdepth[BROTLI_CODE_LENGTH_CODES] = { 0 };
  uint16_t code_length_bitdepth_symbols[BROTLI_CODE_LENGTH_CODES];
  uint32_t huffman_tree_histogram[BROTLI_CODE_LENGTH_CODES] = { 0 };
  size_t i;
  int num_codes = 0;
  size_t code = 0;

  BROTLI_DCHECK(num <= BROTLI_NUM_COMMAND_SYMBOLS);

  BrotliWriteHuffmanTree(depths, num, &huffman_tree_size, huffman_tree,
                         huffman_tree_extra_bits);

  /* Calculate the statistics of the Huffman tree in brotli-representation. */
  for (i = 0; i < huffman_tree_size; ++i) {
    ++huffman_tree_histogram[huffman_tree[i]];
  }

  for (i = 0; i < BROTLI_CODE_LENGTH_CODES; ++i) {
    if (huffman_tree_histogram[i]) {
      if (num_codes == 0) {
        code = i;
        num_codes = 1;
      } else if (num_codes == 1) {
        num_codes = 2;
        break;
      }
    }
  }

  /* Calculate another Huffman tree to use for compressing both the
     earlier Huffman tree with. */
  BrotliCreateHuffmanTree(huffman_tree_histogram, BROTLI_CODE_LENGTH_CODES,
                          5, tree, code_length_bitdepth);
  BrotliConvertBitDepthsToSymbols(code_length_bitdepth,
                                  BROTLI_CODE_LENGTH_CODES,
                                  code_length_bitdepth_symbols);

  /* Now, we have all the data, let's start storing it */
  BrotliStoreHuffmanTreeOfHuffmanTreeToBitMask(num_codes, code_length_bitdepth,
                                               storage_ix, storage);

  if (num_codes == 1) {
    code_length_bitdepth[code] = 0;
  }

  /* Store the real Huffman tree now. */
  BrotliStoreHuffmanTreeToBitMask(huffman_tree_size,
                                  huffman_tree,
                                  huffman_tree_extra_bits,
                                  code_length_bitdepth,
                                  code_length_bitdepth_symbols,
                                  storage_ix, storage);
}